

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O0

void __thiscall
AI::HierarchicalTaskNetworkComponent::createPlan
          (HierarchicalTaskNetworkComponent *this,TaskIdentifier goal)

{
  World *this_00;
  GameMode *this_01;
  mapped_type *initialTask;
  Plan local_98;
  TaskDatabase *local_20;
  TaskDatabase *tasks;
  HierarchicalTaskNetworkComponent *pHStack_10;
  TaskIdentifier goal_local;
  HierarchicalTaskNetworkComponent *this_local;
  
  tasks._4_4_ = goal;
  pHStack_10 = this;
  this_00 = Component::getWorld(&this->super_Component);
  this_01 = World::getAuthGameMode(this_00);
  local_20 = GameMode::getAvailableTasks(this_01);
  initialTask = std::
                map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
                ::operator[](&local_20->tasks,(key_type *)((long)&tasks + 4));
  generatePlan(&local_98,initialTask,&this->state,&this->worldQuerySystem,
               &(this->planner).parameters,local_20);
  Plan::operator=(&(this->planner).plan,&local_98);
  Plan::~Plan(&local_98);
  if ((((this->planner).plan.failed & 1U) != 0) &&
     (fixFailedPlan(&(this->planner).plan,&this->state,&(this->planner).parameters,local_20),
     ((this->planner).plan.failed & 1U) != 0)) {
    createPlan(this,Null);
  }
  Plan::start(&(this->planner).plan);
  updateHUD_PlanPath(this);
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::createPlan(TaskIdentifier goal)
{
	auto& tasks = getWorld()->getAuthGameMode()->getAvailableTasks();
	planner.plan = generatePlan(tasks.tasks[goal], state, worldQuerySystem, planner.parameters, tasks);

	if (planner.plan.failed)
	{
		fixFailedPlan(planner.plan, state, planner.parameters, tasks);

		if (planner.plan.failed)
		{
			createPlan(TaskIdentifier::Null);
		}
	}

	planner.plan.start();
	updateHUD_PlanPath();
}